

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void chold(double *A,int N)

{
  double *U22_00;
  double *U22;
  int local_20;
  int t;
  int j;
  int i;
  int stride;
  int N_local;
  double *A_local;
  
  U22_00 = (double *)malloc((long)N * 8 * (long)N);
  rchold(A,N,N,U22_00);
  for (t = 0; t < N; t = t + 1) {
    for (local_20 = 0; local_20 < t; local_20 = local_20 + 1) {
      A[t * N + local_20] = 0.0;
    }
  }
  free(U22_00);
  return;
}

Assistant:

void chold(double *A, int N) {
	int stride,i,j,t;
	double *U22;
	U22 = (double*) malloc(sizeof(double) * N * N);
	stride = N; 
	
	rchold(A,N,stride,U22);
	
	for(i=0; i < N;++i) {
		t = i *N;
		for(j=0;j < i;++j) {
			A[t+j] = 0.;
		}
	}

	free(U22);
	
}